

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTextureCubeMapArrayImageTextureSize.cpp
# Opt level: O2

char * __thiscall
glcts::TextureCubeMapArrayTextureSizeTFTessControlShader::getFragmentShaderCode
          (TextureCubeMapArrayTextureSizeTFTessControlShader *this)

{
  return "${VERSION}\n\nprecision highp float;\n\nvoid main()\n{\n}\n";
}

Assistant:

const char* TextureCubeMapArrayTextureSizeTFTessControlShader::getFragmentShaderCode(void)
{
	static const char* result = "${VERSION}\n"
								"\n"
								"precision highp float;\n"
								"\n"
								"void main()\n"
								"{\n"
								"}\n";
	return result;
}